

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int nscookiejar_iterate(lws_cache_nscookiejar_t *cache,int fd,nsc_cb_t cb,void *opaque)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  __off_t _Var6;
  ulong uVar7;
  size_t sVar8;
  ssize_t sVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  size_t __n;
  ulong uVar15;
  char temp [256];
  char local_138 [264];
  
  _Var6 = lseek(fd,0,0);
  if (_Var6 == -1) {
    iVar5 = -1;
  }
  else {
    uVar10 = 1;
    uVar11 = 0;
    uVar15 = 0;
    bVar1 = false;
    bVar2 = false;
    do {
      _lws_log(0x10,"%s: n %d, m %d\n","nscookiejar_iterate",uVar15,uVar11 & 0xffffffff);
      sVar12 = uVar11 & 0xffffffff;
      uVar7 = read(fd,local_138 + sVar12,0x100 - sVar12);
      _lws_log(0x10,"%s: n1 %d\n","nscookiejar_iterate",uVar7 & 0xffffffff);
      if (0 < (int)uVar7) {
        uVar15 = (ulong)(uint)((int)uVar15 + (int)uVar7);
LAB_0010f2eb:
        do {
          iVar5 = (int)uVar15;
          uVar11 = (ulong)iVar5;
          lVar14 = sVar12 << 0x20;
          sVar3 = sVar12;
          do {
            sVar8 = sVar3;
            if ((long)uVar11 <= (long)sVar8) {
              if ((long)uVar11 < (long)sVar12) {
                uVar11 = sVar12;
              }
              if (uVar11 == 0) {
                uVar11 = 0;
              }
              else if ((bVar1) || (((iVar5 != 0 && (uVar10 == 1)) && (local_138[0] == '#')))) {
                uVar10 = 0;
                bVar1 = true;
              }
              else {
                iVar5 = (*cb)(cache,opaque,SUB14(bVar2 && iVar5 == (int)uVar11,0) * 2 | uVar10,
                              local_138,uVar11 & 0xffffffff);
                if (iVar5 != 0) {
                  return iVar5;
                }
                uVar11 = 0;
                uVar15 = 0;
                uVar10 = 0;
                bVar1 = false;
              }
              goto LAB_0010f42a;
            }
            lVar14 = lVar14 + 0x100000000;
            sVar3 = sVar8 + 1;
          } while (local_138[sVar8] != '\n');
          bVar1 = false;
          iVar4 = 0;
          if (local_138[0] != '#') {
            iVar4 = (*cb)(cache,opaque,uVar10 | 2,local_138,sVar8);
          }
          iVar13 = (int)(sVar8 + 1);
          __n = (size_t)(iVar5 - iVar13);
          memmove(local_138,local_138 + (lVar14 >> 0x20),__n);
          sVar9 = read(fd,local_138 + __n,0x100 - __n);
          uVar10 = 1;
          sVar12 = 0;
          uVar15 = (ulong)(uint)(((int)sVar9 + iVar5) - iVar13);
          if (iVar4 != 0) {
            return iVar4;
          }
        } while( true );
      }
      bVar2 = true;
      if ((int)uVar11 != (int)uVar15) goto LAB_0010f2eb;
      uVar15 = uVar11 & 0xffffffff;
LAB_0010f42a:
    } while ((int)uVar15 != (int)uVar11 || !bVar2);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
nscookiejar_iterate(lws_cache_nscookiejar_t *cache, int fd,
		    nsc_cb_t cb, void *opaque)
{
	int m = 0, n = 0, e, r = LCN_SOL, ignore = 0, ret = 0;
	char temp[256], eof = 0;

	if (lseek(fd, 0, SEEK_SET) == (off_t)-1)
		return -1;

	do { /* for as many buffers in the file */

		int n1;

		lwsl_debug("%s: n %d, m %d\n", __func__, n, m);

		n1 = (int)read(fd, temp + m, sizeof(temp) - (size_t)m);

		lwsl_debug("%s: n1 %d\n", __func__, n1);

		if (n1 <= 0) {
			eof = 1;
			if (m == n)
				continue;
		} else
			n += n1;

		while (m < n) {

			m++;

			if (temp[m - 1] != '\n')
				continue;

			/* ie, we hit EOL */

			if (temp[0] == '#')
				/* lines starting with # are comments */
				e = 0;
			else
				e = cb(cache, opaque, r | LCN_EOL, temp,
				       (size_t)m - 1);
			r = LCN_SOL;
			ignore = 0;
			/*
			 * Move back remainder and prefill the gap that opened
			 * up: we want to pass enough in the start chunk so the
			 * cb can classify it even if it can't get all the
			 * value part in one go
			 */
			memmove(temp, temp + m, (size_t)(n - m));
			n -= m;
			m = 0;

			n1 = (int)read(fd, temp + n, sizeof(temp) - (size_t)n);
			n += n1;

			if (e) {
				ret = e;
				goto bail;
			}
		}

		if (m) {
			/* we ran out of buffer */
			if (ignore || (r == LCN_SOL && n && temp[0] == '#')) {
				e = 0;
				ignore = 1;
			} else {
				e = cb(cache, opaque,
				       r | (n == m && eof ? LCN_EOL : 0),
				       temp, (size_t)m);

				m = 0;
				n = 0;
			}

			if (e) {
				/*
				 * We have to call off the whole thing if any
				 * step, eg, OOMs
				 */
				ret = e;
				goto bail;
			}
			r = 0;
		}

	} while (!eof || n != m);

	ret = 0;

bail:

	return ret;
}